

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist.h
# Opt level: O0

void __thiscall LinkList<Statistic>::Erase(LinkList<Statistic> *this)

{
  InternalNode *this_00;
  LinkList<Statistic> *this_local;
  
  this->pnLastRef = this->pnHead;
  while (this->pnLastRef != (InternalNode *)0x0) {
    this->pnHead = this->pnLastRef->next;
    this_00 = this->pnLastRef;
    if (this_00 != (InternalNode *)0x0) {
      InternalNode::~InternalNode(this_00);
      operator_delete(this_00);
    }
    this->pnLastRef = this->pnHead;
  }
  SetNull(this);
  return;
}

Assistant:

inline void LinkList<T>::Erase()
{
   pnLastRef = pnHead;

   while (pnLastRef != NULL)
   {
      pnHead = pnLastRef->next;
      delete pnLastRef;
      pnLastRef = pnHead;
   }
   SetNull();
}